

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

void __thiscall METADemuxer::readClose(METADemuxer *this)

{
  bool bVar1;
  reference pSVar2;
  StreamInfo *codecInfo;
  iterator __end1;
  iterator __begin1;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *__range1;
  METADemuxer *this_local;
  
  __end1 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::begin(&this->m_codecInfo);
  codecInfo = (StreamInfo *)
              std::vector<StreamInfo,_std::allocator<StreamInfo>_>::end(&this->m_codecInfo);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                                *)&codecInfo);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
             ::operator*(&__end1);
    (*pSVar2->m_dataReader->_vptr_AbstractReader[7])
              (pSVar2->m_dataReader,(ulong)(uint)pSVar2->m_readerID);
    if (pSVar2->m_streamReader != (AbstractStreamReader *)0x0) {
      (*(pSVar2->m_streamReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[1])
                ();
    }
    __gnu_cxx::
    __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>::
    operator++(&__end1);
  }
  std::vector<StreamInfo,_std::allocator<StreamInfo>_>::clear(&this->m_codecInfo);
  return;
}

Assistant:

void METADemuxer::readClose()
{
    for (const auto& codecInfo : m_codecInfo)
    {
        codecInfo.m_dataReader->deleteReader(codecInfo.m_readerID);
        delete codecInfo.m_streamReader;
    }
    m_codecInfo.clear();
}